

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::IStreamingReporter::listTests
          (IStreamingReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
          IConfig *config)

{
  TestCaseInfo *this_00;
  pointer pcVar1;
  pointer pTVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  Code _colourCode;
  pointer pTVar7;
  Colour colourGuard;
  char local_9a;
  char local_99;
  enable_if_t<_::Catch::Detail::IsStreamInsertable<SourceLineInfo>::value,_std::string> local_98;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  size_t local_50;
  size_t local_48;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *local_40;
  pointer local_38;
  
  iVar3 = (*config->_vptr_IConfig[0xe])(config);
  if ((char)iVar3 == '\0') {
    pcVar6 = "All available test cases:\n";
    lVar5 = 0x1a;
  }
  else {
    pcVar6 = "Matching test cases:\n";
    lVar5 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  pTVar7 = (tests->super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  local_40 = tests;
  if (pTVar7 != local_38) {
    do {
      this_00 = pTVar7->m_info;
      _colourCode = FileName;
      if ((this_00->properties & IsHidden) == None) {
        _colourCode = None;
      }
      local_99 = '\0';
      Colour::use(_colourCode);
      pcVar1 = (this_00->name)._M_dataplus._M_p;
      local_78 = (undefined1  [8])local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar1,pcVar1 + (this_00->name)._M_string_length);
      local_68._16_8_ = 0x4f;
      local_48 = 2;
      local_50 = 4;
      TextFlow::operator<<((ostream *)&std::cout,(Column *)local_78);
      local_98._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
      if (local_78 != (undefined1  [8])local_68) {
        operator_delete((void *)local_78,local_68._0_8_ + 1);
      }
      iVar3 = (*config->_vptr_IConfig[0x14])();
      if (1 < iVar3) {
        StringMaker<Catch::SourceLineInfo,_void>::convert<Catch::SourceLineInfo>
                  (&local_98,&this_00->lineInfo);
        local_78 = (undefined1  [8])local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,local_98._M_dataplus._M_p,
                   local_98._M_dataplus._M_p + local_98._M_string_length);
        local_68._16_8_ = 0x4f;
        local_48 = 0xffffffffffffffff;
        local_50 = 4;
        TextFlow::operator<<((ostream *)&std::cout,(Column *)local_78);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        if (local_78 != (undefined1  [8])local_68) {
          operator_delete((void *)local_78,local_68._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      if ((this_00->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this_00->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar3 = (*config->_vptr_IConfig[0x14])();
        if (0 < iVar3) {
          TestCaseInfo::tagsAsString_abi_cxx11_(&local_98,this_00);
          local_78 = (undefined1  [8])local_68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          local_68._16_8_ = 0x4f;
          local_48 = 0xffffffffffffffff;
          local_50 = 6;
          TextFlow::operator<<((ostream *)&std::cout,(Column *)local_78);
          local_9a = '\n';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_9a,1);
          if (local_78 != (undefined1  [8])local_68) {
            operator_delete((void *)local_78,local_68._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (local_99 == '\0') {
        Colour::use(None);
      }
      pTVar7 = pTVar7 + 1;
    } while (pTVar7 != local_38);
  }
  iVar3 = (*config->_vptr_IConfig[0xe])(config);
  if ((char)iVar3 == '\0') {
    pTVar7 = (local_40->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (local_40->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test case","");
    local_78 = (undefined1  [8])((long)pTVar2 - (long)pTVar7 >> 4);
    local_70._M_p = local_68 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    operator<<((ostream *)&std::cout,(pluralise *)local_78);
    local_9a = '\n';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_9a,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    pTVar7 = (local_40->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (local_40->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"matching test case","");
    local_78 = (undefined1  [8])((long)pTVar2 - (long)pTVar7 >> 4);
    local_70._M_p = local_68 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    operator<<((ostream *)&std::cout,(pluralise *)local_78);
    local_9a = '\n';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_9a,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if (local_70._M_p != local_68 + 8) {
    operator_delete(local_70._M_p,local_68._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void IStreamingReporter::listTests(std::vector<TestCaseHandle> const &tests, IConfig const &config) {
        if (config.hasTestFilters()) {
            Catch::cout() << "Matching test cases:\n";
        }
        else {
            Catch::cout() << "All available test cases:\n";
        }

        for (auto const &test : tests) {
            auto const &testCaseInfo = test.getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard(colour);

            Catch::cout() << TextFlow::Column(testCaseInfo.name).initialIndent(2).indent(4) << '\n';
            if (config.verbosity() >= Verbosity::High) {
                Catch::cout() << TextFlow::Column(Catch::Detail::stringify(testCaseInfo.lineInfo)).indent(4) << std::endl;
            }
            if (!testCaseInfo.tags.empty() && config.verbosity() > Verbosity::Quiet) {
                Catch::cout() << TextFlow::Column(testCaseInfo.tagsAsString()).indent(6) << '\n';
            }
        }

        if (!config.hasTestFilters()) {
            Catch::cout() << pluralise(tests.size(), "test case") << '\n' << std::endl;
        }
        else {
            Catch::cout() << pluralise(tests.size(), "matching test case") << '\n' << std::endl;
        }
    }